

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

int __thiscall despot::BaseRockSample::NextState(BaseRockSample *this,int s,ACT_TYPE a)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  Coord rob_pos;
  Coord rob_pos_1;
  
  iVar3 = (**(code **)(*(long *)this + 0x10))();
  if (iVar3 + -1 != s) {
    _rob_pos = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
    if (3 < a) {
      if (a != 4) {
        return s;
      }
      _rob_pos_1 = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
      piVar4 = Grid<int>::operator()(&this->grid_,&rob_pos_1);
      bVar1 = (byte)*piVar4 & 0x1f;
      uVar5 = 0xffffffff;
      if (-1 < *piVar4) {
        uVar5 = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
      }
      return s & uVar5;
    }
    despot::operator+=(&rob_pos,(Coord *)(&Compass::DIRECTIONS + a));
    bVar2 = Grid<int>::Inside(&this->grid_,&rob_pos);
    if (bVar2) {
      bVar1 = (byte)this->num_rocks_;
      return (((int)((ulong)_rob_pos >> 0x20) * (this->grid_).xsize_ + _rob_pos) -
              (s >> (bVar1 & 0x1f)) << (bVar1 & 0x1f)) + s;
    }
    if (_rob_pos != (this->grid_).xsize_) {
      return s;
    }
  }
  iVar3 = (**(code **)(*(long *)this + 0x10))(this);
  return iVar3 + -1;
}

Assistant:

int BaseRockSample::NextState(int s, ACT_TYPE a) const {
	if (s == NumStates() - 1)
		return NumStates() - 1;

	Coord rob_pos = IndexToCoord(s >> num_rocks_);
	if (a < E_SAMPLE) {
		rob_pos += Compass::DIRECTIONS[a];
		if (grid_.Inside(rob_pos)) {
			int next_pos = CoordToIndex(rob_pos);
			return s + ((next_pos - (s >> num_rocks_)) << num_rocks_);
		} else {
			return rob_pos.x == grid_.xsize() ? (NumStates() - 1) : s;
		}
	} else if (a == E_SAMPLE) {
		int next = s;
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		int rock = grid_(rob_pos);
		if (rock >= 0)
			UnsetFlag(next, rock);
		return next;
	} else
		return s;
}